

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O1

bool __thiscall
BGParseManager::Process(BGParseManager *this,Job *job,ParallelThreadData *threadData)

{
  code *pcVar1;
  bool bVar2;
  BGParseManager *pBVar3;
  undefined4 *puVar4;
  ThreadContext *threadContext;
  ScriptContext *this_00;
  
  pBVar3 = (BGParseManager *)JsUtil::Job::Manager(job);
  if (pBVar3 != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                       ,0x15d,"(job->Manager() == this)","job->Manager() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  threadContext = ThreadBoundThreadContextManager::EnsureContextForCurrentThread();
  if (threadData->scriptContextBG == (ScriptContext *)0x0) {
    this_00 = Js::ScriptContext::New(threadContext);
    threadData->scriptContextBG = this_00;
    Js::ScriptContext::Initialize(this_00);
    threadData->canDecommit = true;
  }
  BGParseWorkItem::ParseUTF8Core((BGParseWorkItem *)job,threadData->scriptContextBG);
  return true;
}

Assistant:

bool BGParseManager::Process(JsUtil::Job *const job, JsUtil::ParallelThreadData *threadData) 
{
#if ENABLE_BACKGROUND_JOB_PROCESSOR
    Assert(job->Manager() == this);
    
    // Create script context on this thread
    ThreadContext* threadContext = ThreadBoundThreadContextManager::EnsureContextForCurrentThread();

    // If there is no script context created for this thread yet, create it now
    if (threadData->scriptContextBG == nullptr)
    {
        threadData->scriptContextBG = Js::ScriptContext::New(threadContext);
        threadData->scriptContextBG->Initialize();
        threadData->canDecommit = true;
    }
    
    // Parse the workitem's data
    BGParseWorkItem* workItem = (BGParseWorkItem*)job;
    workItem->ParseUTF8Core(threadData->scriptContextBG);

    return true;
#else
    Assert(!"BGParseManager does not work without ThreadContext");
    return false;
#endif
}